

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::TimeZoneFormat::formatGeneric
          (TimeZoneFormat *this,TimeZone *tz,int32_t genType,UDate date,UnicodeString *name)

{
  TimeZoneGenericNames *this_00;
  UnicodeString *pUVar1;
  UErrorCode status;
  ConstChar16Ptr local_90;
  UDate local_88;
  UErrorCode local_6c;
  UnicodeString local_68;
  
  local_6c = U_ZERO_ERROR;
  local_88 = date;
  this_00 = getTimeZoneGenericNames(this,&local_6c);
  if (local_6c < U_ILLEGAL_ARGUMENT_ERROR) {
    if (genType != 1) {
      pUVar1 = TimeZoneGenericNames::getDisplayName(this_00,tz,genType,local_88,name);
      return pUVar1;
    }
    local_90.p_ = ZoneMeta::getCanonicalCLDRID(tz);
    if (local_90.p_ != (UChar *)0x0) {
      UnicodeString::UnicodeString(&local_68,'\x01',&local_90,-1);
      pUVar1 = TimeZoneGenericNames::getGenericLocationName(this_00,&local_68,name);
      UnicodeString::~UnicodeString(&local_68);
      return pUVar1;
    }
  }
  UnicodeString::setToBogus(name);
  return name;
}

Assistant:

UnicodeString&
TimeZoneFormat::formatGeneric(const TimeZone& tz, int32_t genType, UDate date, UnicodeString& name) const {
    UErrorCode status = U_ZERO_ERROR;
    const TimeZoneGenericNames* gnames = getTimeZoneGenericNames(status);
    if (U_FAILURE(status)) {
        name.setToBogus();
        return name;
    }

    if (genType == UTZGNM_LOCATION) {
        const UChar* canonicalID = ZoneMeta::getCanonicalCLDRID(tz);
        if (canonicalID == NULL) {
            name.setToBogus();
            return name;
        }
        return gnames->getGenericLocationName(UnicodeString(TRUE, canonicalID, -1), name);
    }
    return gnames->getDisplayName(tz, (UTimeZoneGenericNameType)genType, date, name);
}